

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O0

void __thiscall leveldb::TestState::Change(TestState *this,ReaderState s)

{
  ReaderState s_local;
  TestState *this_local;
  
  port::Mutex::Lock(&this->mu_);
  this->state_ = s;
  port::CondVar::Signal(&this->state_cv_);
  port::Mutex::Unlock(&this->mu_);
  return;
}

Assistant:

LOCKS_EXCLUDED(mu_) {
    mu_.Lock();
    state_ = s;
    state_cv_.Signal();
    mu_.Unlock();
  }